

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::autoPartitionGetDeviceIDs
          (CLIntercept *this,cl_platform_id platform,cl_device_type device_type,cl_uint num_entries,
          cl_device_id *devices,cl_uint *num_devices)

{
  cl_api_clGetDeviceIDs p_Var1;
  cl_api_clCreateSubDevices p_Var2;
  __normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
  __last;
  cl_uint cVar3;
  _cl_device_id *p_Var4;
  bool bVar5;
  SConfig *pSVar6;
  cl_icd_dispatch *pcVar7;
  _cl_device_id **pp_Var8;
  reference pp_Var9;
  ulong uVar10;
  size_type sVar11;
  reference pp_Var12;
  uint in_ECX;
  cl_device_type in_RDX;
  cl_platform_id in_RSI;
  CLIntercept *in_RDI;
  long in_R8;
  undefined4 *in_R9;
  float fVar13;
  float __x;
  cl_uint d;
  cl_uint numSubDevices_1;
  cl_device_partition_property props_1 [3];
  cl_uint numSubDevices;
  cl_device_partition_property props [3];
  string deviceInfo;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *subDevices;
  _cl_device_id *parent;
  iterator __end1;
  iterator __begin1;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *__range1;
  cl_uint numDevices;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> returnedDevices;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> parentDevices;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  cl_int cVar14;
  value_type *in_stack_fffffffffffffd78;
  SConfig *in_stack_fffffffffffffd80;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *in_stack_fffffffffffffd88;
  iterator in_stack_fffffffffffffd90;
  SConfig *in_stack_fffffffffffffda8;
  _cl_device_id *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  cl_uint in_stack_fffffffffffffdbc;
  __normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
  in_stack_fffffffffffffdc0;
  const_iterator in_stack_fffffffffffffdc8;
  byte local_151;
  uint local_140;
  int local_13c;
  iterator in_stack_fffffffffffffec8;
  iterator in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  cl_uint local_10c;
  cl_device_partition_property local_108;
  ulong local_100;
  undefined8 local_f8;
  cl_uint local_ec;
  cl_device_partition_property local_e8 [3];
  string local_d0 [32];
  mapped_type *local_b0;
  _cl_device_id *local_a8;
  _cl_device_id **local_a0;
  __normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
  local_98;
  undefined1 *local_90;
  cl_uint local_84;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> local_80;
  undefined1 local_68 [24];
  cl_int local_50;
  bool local_39 [9];
  undefined4 *local_30;
  long local_28;
  uint local_1c;
  cl_device_type local_18;
  cl_platform_id local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
             ,in_stack_fffffffffffffd68);
  pSVar6 = config(in_RDI);
  local_151 = 1;
  if ((pSVar6->AutoPartitionAllDevices & 1U) == 0) {
    pSVar6 = config(in_RDI);
    local_151 = 1;
    if ((pSVar6->AutoPartitionAllSubDevices & 1U) == 0) {
      pSVar6 = config(in_RDI);
      local_151 = pSVar6->AutoPartitionSingleSubDevice;
    }
  }
  local_39[0] = (bool)(local_151 & 1);
  std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,local_39);
  local_50 = 0;
  std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
            ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x1f65c3);
  std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
            ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x1f65d0);
  local_84 = 0;
  pcVar7 = dispatch(in_RDI);
  local_50 = (*pcVar7->clGetDeviceIDs)(local_10,local_18,0,(cl_device_id *)0x0,&local_84);
  if ((local_50 == 0) && (local_84 != 0)) {
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
              ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
               in_stack_fffffffffffffd90._M_current,(size_type)in_stack_fffffffffffffd88);
    pcVar7 = dispatch(in_RDI);
    cVar3 = local_84;
    p_Var1 = pcVar7->clGetDeviceIDs;
    pp_Var8 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::data
                        ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x1f66cd);
    local_50 = (*p_Var1)(local_10,local_18,cVar3,pp_Var8,(cl_uint *)0x0);
  }
  local_90 = local_68;
  local_98._M_current =
       (_cl_device_id **)
       std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::begin
                 ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                  in_stack_fffffffffffffd68);
  local_a0 = (_cl_device_id **)
             std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::end
                       ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                        in_stack_fffffffffffffd68);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            (__normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
                             *)in_stack_fffffffffffffd68), bVar5) {
    pp_Var9 = __gnu_cxx::
              __normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
              ::operator*(&local_98);
    local_a8 = *pp_Var9;
    local_b0 = std::
               map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
               ::operator[]((map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
                             *)in_stack_fffffffffffffdb0,(key_type *)in_stack_fffffffffffffda8);
    bVar5 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::empty
                      ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                       in_stack_fffffffffffffd80);
    if (bVar5) {
      std::__cxx11::string::string(local_d0);
      getDeviceInfoString((CLIntercept *)in_stack_fffffffffffffee0._M_current,
                          (cl_uint)((ulong)in_stack_fffffffffffffed8._M_current >> 0x20),
                          in_stack_fffffffffffffed0._M_current,
                          (string *)in_stack_fffffffffffffec8._M_current);
      sVar11 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(local_b0);
      if ((sVar11 == 0) &&
         (pSVar6 = config(in_RDI), (pSVar6->AutoPartitionByAffinityDomain & 1U) != 0)) {
        local_e8[0] = 0x1088;
        local_e8[1] = 0x20;
        local_e8[2] = 0;
        local_ec = 0;
        pcVar7 = dispatch(in_RDI);
        (*pcVar7->clCreateSubDevices)(local_a8,local_e8,0,(cl_device_id *)0x0,&local_ec);
        if (1 < local_ec) {
          fVar13 = (float)std::__cxx11::string::c_str();
          logf(in_RDI,fVar13);
          std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                    ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                     in_stack_fffffffffffffd90._M_current,(size_type)in_stack_fffffffffffffd88);
          pcVar7 = dispatch(in_RDI);
          p_Var4 = local_a8;
          cVar3 = local_ec;
          p_Var2 = pcVar7->clCreateSubDevices;
          pp_Var8 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::data
                              ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x1f6991
                              );
          (*p_Var2)(p_Var4,local_e8,cVar3,pp_Var8,(cl_uint *)0x0);
        }
      }
      sVar11 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(local_b0);
      if ((sVar11 == 0) && (pSVar6 = config(in_RDI), pSVar6->AutoPartitionEqually != 0)) {
        local_108 = 0x1086;
        pSVar6 = config(in_RDI);
        local_100 = (ulong)pSVar6->AutoPartitionEqually;
        local_f8 = 0;
        local_10c = 0;
        pcVar7 = dispatch(in_RDI);
        (*pcVar7->clCreateSubDevices)(local_a8,&local_108,0,(cl_device_id *)0x0,&local_10c);
        if (1 < local_10c) {
          std::__cxx11::string::c_str();
          config(in_RDI);
          config(in_RDI);
          logf(in_RDI,__x);
          std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                    ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                     in_stack_fffffffffffffd90._M_current,(size_type)in_stack_fffffffffffffd88);
          in_stack_fffffffffffffdc8._M_current = (_cl_device_id **)dispatch(in_RDI);
          in_stack_fffffffffffffdc0._M_current =
               (_cl_device_id **)
               ((cl_icd_dispatch *)in_stack_fffffffffffffdc8._M_current)->clCreateSubDevices;
          in_stack_fffffffffffffdb0 = local_a8;
          in_stack_fffffffffffffdbc = local_10c;
          pp_Var8 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::data
                              ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x1f6be8
                              );
          (*(code *)in_stack_fffffffffffffdc0._M_current)
                    (in_stack_fffffffffffffdb0,&local_108,in_stack_fffffffffffffdbc,pp_Var8,0);
        }
      }
      sVar11 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(local_b0);
      if (sVar11 == 0) {
        fVar13 = (float)std::__cxx11::string::c_str();
        logf(in_RDI,fVar13);
      }
      std::__cxx11::string::~string(local_d0);
    }
    sVar11 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(local_b0);
    if (sVar11 == 0) {
      std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::push_back
                ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
    else {
      in_stack_fffffffffffffda8 = config(in_RDI);
      if ((in_stack_fffffffffffffda8->AutoPartitionAllDevices & 1U) != 0) {
        std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::push_back
                  ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                   in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      }
      pSVar6 = config(in_RDI);
      if (((pSVar6->AutoPartitionAllDevices & 1U) == 0) &&
         (pSVar6 = config(in_RDI), (pSVar6->AutoPartitionAllSubDevices & 1U) == 0)) {
        in_stack_fffffffffffffd80 = config(in_RDI);
        if ((in_stack_fffffffffffffd80->AutoPartitionSingleSubDevice & 1U) == 0) {
          local_13c = 0;
          std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_13c);
          std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::push_back
                    ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        }
        else {
          std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::front
                    ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                     CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
          std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::push_back
                    ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        }
      }
      else {
        in_stack_fffffffffffffd88 = &local_80;
        in_stack_fffffffffffffee0 =
             std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::end
                       ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                        in_stack_fffffffffffffd68);
        __gnu_cxx::
        __normal_iterator<_cl_device_id*const*,std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>>
        ::__normal_iterator<_cl_device_id**>
                  ((__normal_iterator<_cl_device_id_*const_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                   (__normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
                    *)in_stack_fffffffffffffd68);
        in_stack_fffffffffffffed8 =
             std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::begin
                       ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                        in_stack_fffffffffffffd68);
        in_stack_fffffffffffffed0 =
             std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::end
                       ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                        in_stack_fffffffffffffd68);
        __last._M_current._4_4_ = in_stack_fffffffffffffdbc;
        __last._M_current._0_4_ = in_stack_fffffffffffffdb8;
        in_stack_fffffffffffffd90 =
             std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
             insert<__gnu_cxx::__normal_iterator<_cl_device_id**,std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>>,void>
                       ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                        in_stack_fffffffffffffdb0,in_stack_fffffffffffffdc8,
                        in_stack_fffffffffffffdc0,__last);
        in_stack_fffffffffffffec8 = in_stack_fffffffffffffd90;
      }
    }
    __gnu_cxx::
    __normal_iterator<_cl_device_id_**,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>
    ::operator++(&local_98);
  }
  if (local_50 == 0) {
    local_140 = 0;
    while( true ) {
      uVar10 = (ulong)local_140;
      sVar11 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(&local_80);
      if (sVar11 <= uVar10) break;
      if (local_140 < local_1c) {
        pp_Var12 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::operator[]
                             (&local_80,(ulong)local_140);
        *(value_type *)(local_28 + (ulong)local_140 * 8) = *pp_Var12;
      }
      local_140 = local_140 + 1;
    }
    if (local_30 != (undefined4 *)0x0) {
      sVar11 = std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(&local_80);
      *local_30 = (int)sVar11;
    }
  }
  cVar14 = local_50;
  std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~vector
            ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)in_stack_fffffffffffffd80)
  ;
  std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~vector
            ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)in_stack_fffffffffffffd80)
  ;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f6f18);
  return cVar14;
}

Assistant:

cl_int CLIntercept::autoPartitionGetDeviceIDs(
    cl_platform_id platform,
    cl_device_type device_type,
    cl_uint num_entries,
    cl_device_id* devices,
    cl_uint* num_devices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices ||
                config().AutoPartitionSingleSubDevice );

    cl_int  errorCode = CL_SUCCESS;
    std::vector<cl_device_id>   parentDevices;
    std::vector<cl_device_id>   returnedDevices;

    cl_uint numDevices = 0;
    errorCode = dispatch().clGetDeviceIDs(
        platform,
        device_type,
        0,
        NULL,
        &numDevices );
    if( errorCode == CL_SUCCESS && numDevices != 0 )
    {
        parentDevices.resize(numDevices);
        errorCode = dispatch().clGetDeviceIDs(
            platform,
            device_type,
            numDevices,
            parentDevices.data(),
            NULL );
    }

    for( auto parent : parentDevices )
    {
        std::vector<cl_device_id>&  subDevices = m_SubDeviceCacheMap[parent];

        if( subDevices.empty() )
        {
            std::string deviceInfo;
            getDeviceInfoString(
                1,
                &parent,
                deviceInfo );

            if( subDevices.size() == 0 &&
                config().AutoPartitionByAffinityDomain )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_BY_AFFINITY_DOMAIN,
                    CL_DEVICE_AFFINITY_DOMAIN_NEXT_PARTITIONABLE,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s by affinity domain into %u sub-devices.\n",
                        deviceInfo.c_str(),
                        numSubDevices );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 &&
                config().AutoPartitionEqually )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_EQUALLY,
                    (cl_device_partition_property)config().AutoPartitionEqually,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s equally into %u sub-devices with %u compute unit%s.\n",
                        deviceInfo.c_str(),
                        numSubDevices,
                        config().AutoPartitionEqually,
                        config().AutoPartitionEqually > 1 ? "s" : "" );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 )
            {
                logf("Couldn't partition device %s.\n",
                    deviceInfo.c_str() );
            }
        }

        if( subDevices.size() == 0 )
        {
            returnedDevices.push_back(parent);
        }
        else
        {
            if( config().AutoPartitionAllDevices )
            {
                returnedDevices.push_back(parent);
            }
            if( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices )
            {
                returnedDevices.insert(
                    returnedDevices.end(),
                    subDevices.begin(),
                    subDevices.end() );
            }
            else if( config().AutoPartitionSingleSubDevice )
            {
                returnedDevices.push_back( subDevices.front() );
            }
            else
            {
                CLI_ASSERT( 0 );
                returnedDevices.push_back( parent );
            }
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint d = 0; d < returnedDevices.size(); d++ )
        {
            if( d < num_entries )
            {
                devices[d] = returnedDevices[d];
            }
        }

        if( num_devices )
        {
            num_devices[0] = (cl_uint)returnedDevices.size();
        }
    }

    return errorCode;
}